

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O0

void print_example(MDD example)

{
  uint uVar1;
  long lVar2;
  undefined8 uStack_40;
  uint32_t auStack_38 [2];
  uint32_t *local_30;
  int local_24;
  ulong uStack_20;
  int i;
  unsigned_long __vla_expr0;
  MDD local_10;
  MDD example_local;
  
  __vla_expr0 = (unsigned_long)auStack_38;
  if (example != 0) {
    uStack_20 = (ulong)(uint)vector_size;
    lVar2 = -(uStack_20 * 4 + 0xf & 0xfffffffffffffff0);
    local_30 = (uint32_t *)((long)auStack_38 + lVar2);
    local_10 = example;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x105661;
    lddmc_sat_one(example,(uint32_t *)((long)auStack_38 + lVar2),(long)vector_size);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10566f;
    printf("[");
    for (local_24 = 0; local_24 < vector_size; local_24 = local_24 + 1) {
      if (0 < local_24) {
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x105695;
        printf(",");
      }
      uVar1 = local_30[local_24];
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1056ae;
      printf("%u",(ulong)uVar1);
    }
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1056c7;
    printf("]");
  }
  return;
}

Assistant:

static void
print_example(MDD example)
{
    if (example != lddmc_false) {
        uint32_t vec[vector_size];
        lddmc_sat_one(example, vec, vector_size);

        printf("[");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(",");
            printf("%" PRIu32, vec[i]);
        }
        printf("]");
    }
}